

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

void hydro_random_buf(void *out,size_t out_len)

{
  long lVar1;
  ulong in_RSI;
  long in_RDI;
  long *in_FS_OFFSET;
  size_t leftover;
  size_t i;
  uint8_t *p;
  undefined8 in_stack_ffffffffffffffd8;
  uint8_t *state_u8;
  
  hydro_random_ensure_initialized();
  for (state_u8 = (uint8_t *)0x0; state_u8 < (uint8_t *)(in_RSI >> 4); state_u8 = state_u8 + 1) {
    gimli_core_u8(state_u8,(uint8_t)((ulong)in_stack_ffffffffffffffd8 >> 0x38));
    lVar1 = *in_FS_OFFSET;
    *(undefined8 *)(in_RDI + (long)state_u8 * 0x10) = *(undefined8 *)(lVar1 + -0x40);
    *(undefined8 *)(in_RDI + 8 + (long)state_u8 * 0x10) = *(undefined8 *)(lVar1 + -0x38);
  }
  if ((in_RSI & 0xf) != 0) {
    gimli_core_u8(state_u8,'\0');
    mem_cpy((void *)(in_RDI + (long)state_u8 * 0x10),(void *)(*in_FS_OFFSET + -0x40),in_RSI & 0xf);
  }
  hydro_random_ratchet();
  return;
}

Assistant:

void
hydro_random_buf(void *out, size_t out_len)
{
    uint8_t *p = (uint8_t *) out;
    size_t   i;
    size_t   leftover;

    hydro_random_ensure_initialized();
    for (i = 0; i < out_len / gimli_RATE; i++) {
        gimli_core_u8(hydro_random_context.state, 0);
        memcpy(p + i * gimli_RATE, hydro_random_context.state, gimli_RATE);
    }
    leftover = out_len % gimli_RATE;
    if (leftover != 0) {
        gimli_core_u8(hydro_random_context.state, 0);
        mem_cpy(p + i * gimli_RATE, hydro_random_context.state, leftover);
    }
    hydro_random_ratchet();
}